

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O2

void __thiscall helics::CommsInterface::CommsInterface(CommsInterface *this)

{
  this->_vptr_CommsInterface = (_func_int **)&PTR__CommsInterface_004c4048;
  (this->rxStatus)._M_i = STARTUP;
  gmlc::concurrency::TriggerVariable::TriggerVariable(&this->rxTrigger,false);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->localTargetAddress)._M_dataplus._M_p = (pointer)&(this->localTargetAddress).field_2;
  (this->localTargetAddress)._M_string_length = 0;
  (this->localTargetAddress).field_2._M_local_buf[0] = '\0';
  (this->brokerTargetAddress)._M_dataplus._M_p = (pointer)&(this->brokerTargetAddress).field_2;
  (this->brokerTargetAddress)._M_string_length = 0;
  (this->brokerTargetAddress).field_2._M_local_buf[0] = '\0';
  (this->brokerName)._M_dataplus._M_p = (pointer)&(this->brokerName).field_2;
  (this->brokerName)._M_string_length = 0;
  (this->brokerName).field_2._M_local_buf[0] = '\0';
  (this->brokerInitString)._M_dataplus._M_p = (pointer)&(this->brokerInitString).field_2;
  (this->brokerInitString)._M_string_length = 0;
  (this->brokerInitString).field_2._M_local_buf[0] = '\0';
  (this->randomID)._M_dataplus._M_p = (pointer)&(this->randomID).field_2;
  (this->randomID)._M_string_length = 0;
  (this->randomID).field_2._M_local_buf[0] = '\0';
  (this->txStatus)._M_i = STARTUP;
  gmlc::concurrency::TriggerVariable::TriggerVariable(&this->txTrigger,false);
  this->operating = (__atomic_base<bool>)0x0;
  this->singleThread = false;
  this->mRequireBrokerConnection = false;
  this->serverMode = true;
  this->autoBroker = false;
  this->useJsonSerialization = false;
  this->observer = false;
  (this->connectionTimeout).__r = 4000;
  this->maxMessageSize = 0x4000;
  this->maxMessageCount = 0x200;
  (this->requestDisconnect)._M_base._M_i = false;
  *(undefined8 *)&(this->ActionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ActionCallback).super__Function_base._M_functor + 8) = 0;
  (this->ActionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ActionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->loggingCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->loggingCallback).super__Function_base._M_functor + 8) = 0;
  (this->loggingCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->loggingCallback)._M_invoker = (_Invoker_type)0x0;
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::BlockingPriorityQueue(&this->txQueue);
  this->disconnecting = (__atomic_base<bool>)0x0;
  this->interfaceNetwork = LOCAL;
  (this->queue_transmitter)._M_id._M_thread = 0;
  (this->queue_watcher)._M_id._M_thread = 0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->threadSyncLock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->threadSyncLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->threadSyncLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  gmlc::concurrency::TripWireDetector::TripWireDetector(&this->tripDetector);
  return;
}

Assistant:

CommsInterface() = default;